

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O0

void __thiscall Float_Overflow_Test::TestBody(Float_Overflow_Test *this)

{
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  Float_Overflow_Test *local_10;
  Float_Overflow_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"1.0e1000",&local_31);
  anon_unknown.dwarf_777f8::test_error(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"-1.0e1000",&local_69);
  anon_unknown.dwarf_777f8::test_error(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

TEST(Float, Overflow) {
    test_error("1.0e1000");
    test_error("-1.0e1000");
}